

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O2

void log_print_callstack(FILE *f,int callstack_depth,void **callstack)

{
  int iVar1;
  iterator iVar2;
  char *__ptr;
  mapped_type *pmVar3;
  ulong uVar4;
  int status;
  allocator local_a1;
  void *local_a0;
  string symbol;
  Dl_info dlinfo;
  string local_50;
  
  if (callstack_depth < 1) {
    fprintf((FILE *)f,"==%d==    error: backtrace() returned empty callstack\n",(ulong)(uint)pid);
    return;
  }
  uVar4 = 1;
  do {
    if ((uint)callstack_depth == uVar4) {
      return;
    }
    fprintf((FILE *)f,"==%d==    at 0x%016lx",(ulong)(uint)pid,callstack[uVar4]);
    if (hu_log_nosyms == 0) {
      local_a0 = callstack[uVar4];
      symbol._M_dataplus._M_p = (pointer)&symbol.field_2;
      symbol._M_string_length = 0;
      symbol.field_2._M_local_buf[0] = '\0';
      iVar2 = std::
              _Rb_tree<void_*,_std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&symbol_cache_abi_cxx11_->_M_t,&local_a0);
      if ((_Rb_tree_header *)iVar2._M_node ==
          &(symbol_cache_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header) {
        iVar1 = dladdr(local_a0,&dlinfo);
        if (dlinfo.dli_sname != (char *)0x0 && iVar1 != 0) {
          if (*dlinfo.dli_sname == '_') {
            status = -1;
            __ptr = (char *)__cxa_demangle(dlinfo.dli_sname,0,0,&status);
            if (__ptr != (char *)0x0) {
              if (status == 0) {
                std::__cxx11::string::string((string *)&local_50,__ptr,&local_a1);
                std::__cxx11::string::operator=((string *)&symbol,(string *)&local_50);
                std::__cxx11::string::~string((string *)&local_50);
              }
              free(__ptr);
            }
          }
          if (symbol._M_string_length == 0) {
            std::__cxx11::string::string((string *)&local_50,dlinfo.dli_sname,(allocator *)&status);
            std::__cxx11::string::operator=((string *)&symbol,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            if (symbol._M_string_length == 0) goto LAB_0010a822;
          }
          std::__cxx11::string::string((string *)&local_50," + ",(allocator *)&status);
          std::__cxx11::string::append((string *)&symbol);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::to_string(&local_50,(long)local_a0 - (long)dlinfo.dli_saddr);
          std::__cxx11::string::append((string *)&symbol);
          std::__cxx11::string::~string((string *)&local_50);
        }
LAB_0010a822:
        pmVar3 = std::
                 map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](symbol_cache_abi_cxx11_,&local_a0);
        std::__cxx11::string::_M_assign((string *)pmVar3);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&symbol);
      }
      fprintf((FILE *)f,": %s\n",symbol._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&symbol);
    }
    else {
      fputc(10,(FILE *)f);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void log_print_callstack(FILE *f, int callstack_depth, void * const callstack[])
{
  if (callstack_depth > 0)
  {
    int i = 1;
    while (i < callstack_depth)
    {
#if UINTPTR_MAX == 0xffffffff
      fprintf(f, "==%d==    at 0x%08x", pid, (unsigned int) callstack[i]);
#else
      fprintf(f, "==%d==    at 0x%016" PRIxPTR, pid, (unsigned long) callstack[i]);
#endif

      if (hu_log_nosyms)
      {
        fprintf(f, "\n");
      }
      else
      {
        std::string symbol = addr_to_symbol(callstack[i]);
        fprintf(f, ": %s\n", symbol.c_str());
      }

      ++i;
    }
  }
  else
  {
    fprintf(f, "==%d==    error: backtrace() returned empty callstack\n", pid);
  }
}